

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::PutVal(TPZSkylMatrix<double> *this,int64_t r,int64_t c,double *value)

{
  double **ppdVar1;
  ostream *poVar2;
  double *pdVar3;
  long lVar4;
  
  lVar4 = r - c;
  if (lVar4 == 0 || r < c) {
    lVar4 = -(r - c);
    r = c;
  }
  ppdVar1 = (this->fElem).fStore;
  pdVar3 = ppdVar1[r];
  if ((long)ppdVar1[r + 1] - (long)pdVar3 >> 3 <= lVar4) {
    if (ABS(*value) < 1e-12) {
      return 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
    std::ostream::_M_insert<long>((long)poVar2);
    std::ostream::flush();
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = double]"
               ,"Index out of range");
    pdVar3 = (this->fElem).fStore[r];
  }
  pdVar3[lVar4] = *value;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}